

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplePacketizerReader.cpp
# Opt level: O2

void __thiscall SimplePacketizerReader::doMplsCorrection(SimplePacketizerReader *this)

{
  double dVar1;
  int iVar2;
  pointer pMVar3;
  long lVar4;
  
  iVar2 = this->m_curMplsIndex;
  if ((long)iVar2 != -1) {
    dVar1 = this->m_lastMplsTime;
    if (dVar1 + -58800.0 <= this->m_curPts) {
      pMVar3 = (this->m_mplsInfo).super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (iVar2 < (int)(((long)(this->m_mplsInfo).
                               super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)pMVar3) / 0x30) +
                  -1) {
        lVar4 = (long)iVar2 + 1;
        this->m_curMplsIndex = (int)lVar4;
        if (pMVar3[lVar4].connection_condition == '\x05') {
          this->m_mplsOffset = (this->m_curPts - dVar1) + this->m_mplsOffset;
        }
        this->m_lastMplsTime =
             (double)(pMVar3[lVar4].OUT_time - pMVar3[lVar4].IN_time) * 117600.0 + dVar1;
      }
    }
  }
  return;
}

Assistant:

void SimplePacketizerReader::doMplsCorrection()
{
    if (m_curMplsIndex == -1)
        return;
    if (m_curPts >= (m_lastMplsTime - mplsEps) && m_curMplsIndex < static_cast<int>(m_mplsInfo.size() - 1))
    {
        m_curMplsIndex++;
        if (m_mplsInfo[m_curMplsIndex].connection_condition == 5)
        {
            m_mplsOffset += m_curPts - m_lastMplsTime;
        }
        m_lastMplsTime +=
            (m_mplsInfo[m_curMplsIndex].OUT_time - m_mplsInfo[m_curMplsIndex].IN_time) * (INTERNAL_PTS_FREQ / 45000.0);
    }
}